

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.h
# Opt level: O0

void stable_rec_stable_sort(int **arr,size_t L)

{
  int iVar1;
  int iVar2;
  int **in_RSI;
  long in_RDI;
  int rest;
  int p1;
  int p0;
  int h;
  int m;
  undefined4 local_1c;
  int L2;
  int L1;
  
  for (L1 = 1; (int **)(long)L1 < in_RSI; L1 = L1 + 2) {
    if (0 < **(int **)(in_RDI + -8 + (long)L1 * 8) - **(int **)(in_RDI + (long)L1 * 8)) {
      stable_grail_swap1((int **)(in_RDI + (long)(L1 + -1) * 8),(int **)(in_RDI + (long)L1 * 8));
    }
  }
  for (L2 = 2; (int **)(long)L2 < in_RSI; L2 = L2 << 1) {
    iVar2 = L2 * -2;
    iVar1 = (int)in_RSI;
    for (local_1c = 0; local_1c <= iVar1 + iVar2; local_1c = L2 * 2 + local_1c) {
      stable_grail_rec_merge(in_RSI,L1,L2);
    }
    if (L2 < (int)in_RSI - local_1c) {
      stable_grail_rec_merge(in_RSI,L1,L2);
    }
  }
  return;
}

Assistant:

void REC_STABLE_SORT(SORT_TYPE *arr, size_t L) {
  int m, h, p0, p1, rest;

  for (m = 1; m < L; m += 2) {
    if (SORT_CMP_A(arr + m - 1, arr + m) > 0) {
      GRAIL_SWAP1(arr + (m - 1), arr + m);
    }
  }

  for (h = 2; h < L; h *= 2) {
    p0 = 0;
    p1 = (int)(L - 2 * h);

    while (p0 <= p1) {
      GRAIL_REC_MERGE(arr + p0, h, h);
      p0 += 2 * h;
    }

    rest = (int)(L - p0);

    if (rest > h) {
      GRAIL_REC_MERGE(arr + p0, h, rest - h);
    }
  }
}